

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtGStateRegistry.cpp
# Opt level: O3

ObjectIDTypeAndBool __thiscall
ExtGStateRegistry::RegisterExtGStateForOpacity(ExtGStateRegistry *this,double inAlphaValue)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  IndirectObjectsReferenceRegistry *this_00;
  _Rb_tree_iterator<std::pair<const_double,_unsigned_long>_> _Var4;
  _Base_ptr p_Var5;
  undefined8 uVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_bool> pVar7;
  ObjectIDTypeAndBool OVar8;
  pair<const_double,_unsigned_long> local_18;
  
  if (this->mObjectsContext == (ObjectsContext *)0x0) {
    p_Var5 = (_Base_ptr)0x0;
    uVar6 = 0;
    goto LAB_001b2fa1;
  }
  p_Var5 = (this->mAlphaExtGstates)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 == (_Base_ptr)0x0) {
LAB_001b2f63:
    this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
    local_18.second = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
    local_18.first = inAlphaValue;
    pVar7 = std::
            _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
            ::_M_insert_unique<std::pair<double_const,unsigned_long>>
                      ((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                        *)&this->mAlphaExtGstates,&local_18);
    _Var4 = pVar7.first._M_node;
    uVar6 = CONCAT71(pVar7._9_7_,1);
  }
  else {
    p_Var1 = &(this->mAlphaExtGstates)._M_t._M_impl.super__Rb_tree_header;
    _Var4._M_node = &p_Var1->_M_header;
    do {
      bVar2 = inAlphaValue != *(double *)(p_Var5 + 1);
      bVar3 = *(double *)(p_Var5 + 1) <= inAlphaValue;
      if (!bVar3 || !bVar2) {
        _Var4._M_node = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[bVar3 && bVar2];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)_Var4._M_node == p_Var1) ||
       (inAlphaValue < *(double *)(_Var4._M_node + 1))) goto LAB_001b2f63;
    uVar6 = 0;
  }
  p_Var5 = _Var4._M_node[1]._M_parent;
LAB_001b2fa1:
  OVar8._8_8_ = uVar6;
  OVar8.first = (unsigned_long)p_Var5;
  return OVar8;
}

Assistant:

ObjectIDTypeAndBool ExtGStateRegistry::RegisterExtGStateForOpacity(double inAlphaValue) {
    if(!mObjectsContext)
        return ObjectIDTypeAndBool(0,false);

    DoubleToObjectIDTypeMap::iterator it = mAlphaExtGstates.find(inAlphaValue);

    if(it == mAlphaExtGstates.end()) {
        ObjectIDType objectId = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();
        it = mAlphaExtGstates.insert(DoubleToObjectIDTypeMap::value_type(inAlphaValue,objectId)).first;
        return ObjectIDTypeAndBool(it->second,true);
    }

    return ObjectIDTypeAndBool(it->second, false);
}